

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O2

TimeProcessingResult __thiscall
helics::TimeCoordinator::processTimeMessage(TimeCoordinator *this,ActionMessage *cmd)

{
  TimeDependencies *this_00;
  GlobalFederateId gid;
  long lVar1;
  TimeProcessingResult TVar2;
  action_t aVar3;
  ulong uVar4;
  DependencyInfo *pDVar5;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  checkRes;
  ActionMessage resp;
  
  aVar3 = cmd->messageAction;
  uVar4 = (ulong)(uint)aVar3;
  if (uVar4 < 0x2d) {
    if ((0x3c8UL >> (uVar4 & 0x3f) & 1) == 0) {
      if ((0x1b0000000000U >> (uVar4 & 0x3f) & 1) != 0) {
        TVar2 = processTimeBlockMessage(this,cmd);
        return TVar2;
      }
      if (uVar4 == 0x26) {
        if (((this->super_BaseTimeCoordinator).disconnected == false) &&
           ((this->lastSend).mTimeState != error)) {
          BaseTimeCoordinator::generateTimeRequest
                    (&resp,&this->super_BaseTimeCoordinator,&this->lastSend,
                     (GlobalFederateId)(cmd->source_id).gid,(uint)cmd->counter);
          if ((this->triggered == true) &&
             (resp.flags._0_1_ = (byte)resp.flags | 2, (cmd->source_id).gid == 1)) {
            this->triggered = false;
          }
          std::function<void_(const_helics::ActionMessage_&)>::operator()
                    (&(this->super_BaseTimeCoordinator).sendMessageFunction,&resp);
          TimeDependencies::updateTime(&(this->super_BaseTimeCoordinator).dependencies,cmd);
        }
        else {
          ActionMessage::ActionMessage
                    (&resp,cmd_disconnect,
                     (GlobalFederateId)(this->super_BaseTimeCoordinator).mSourceId.gid,
                     (GlobalFederateId)(cmd->source_id).gid);
          resp.source_handle.hid = (BaseType)cmd->counter;
          std::function<void_(const_helics::ActionMessage_&)>::operator()
                    (&(this->super_BaseTimeCoordinator).sendMessageFunction,&resp);
        }
        goto LAB_002d4ac7;
      }
      goto LAB_002d4956;
    }
  }
  else {
LAB_002d4956:
    if (aVar3 == cmd_force_time_grant) {
      lVar1 = (cmd->actionTime).internalTimeCode;
      if (lVar1 <= (this->time_granted).internalTimeCode) {
        return NOT_PROCESSED;
      }
      (this->time_granted).internalTimeCode = lVar1;
      (this->time_grantBase).internalTimeCode = lVar1;
      ActionMessage::ActionMessage(&resp,cmd_time_grant);
      resp.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
      resp.actionTime.internalTimeCode = (this->time_granted).internalTimeCode;
      (this->lastSend).next.internalTimeCode = resp.actionTime.internalTimeCode;
      (this->lastSend).Te.internalTimeCode = resp.actionTime.internalTimeCode;
      (this->lastSend).minDe.internalTimeCode = resp.actionTime.internalTimeCode;
      (this->lastSend).mTimeState = time_granted;
      transmitTimingMessages(this,&resp,(GlobalFederateId)0x8831d580);
LAB_002d4ac7:
      ActionMessage::~ActionMessage(&resp);
      return PROCESSED;
    }
    if ((aVar3 != cmd_local_error) && (aVar3 != cmd_global_error)) goto LAB_002d497f;
  }
  (*(this->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[7])
            (this,(ulong)(uint)(cmd->source_id).gid);
  aVar3 = cmd->messageAction;
LAB_002d497f:
  if (((aVar3 == cmd_time_grant) &&
      (gid.gid = (cmd->source_id).gid, gid.gid != (this->super_BaseTimeCoordinator).mSourceId.gid))
     && (pDVar5 = TimeDependencies::getDependencyInfo
                            (&(this->super_BaseTimeCoordinator).dependencies,gid),
        pDVar5 == (DependencyInfo *)0x0)) {
    return NOT_PROCESSED;
  }
  this_00 = &(this->super_BaseTimeCoordinator).dependencies;
  TVar2 = TimeDependencies::updateTime(this_00,cmd);
  if (TVar2 == PROCESSED_AND_CHECK) {
    TimeDependencies::checkForIssues_abi_cxx11_
              (&checkRes,this_00,(this->info).wait_for_current_time_updates);
    if (checkRes.first != 0) {
      ActionMessage::ActionMessage(&resp,cmd_global_error);
      resp.dest_id.gid = 0;
      resp.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
      resp.messageID = checkRes.first;
      SmallBuffer::operator=(&resp.payload,&checkRes.second);
      std::function<void_(const_helics::ActionMessage_&)>::operator()
                (&(this->super_BaseTimeCoordinator).sendMessageFunction,&resp);
      ActionMessage::~ActionMessage(&resp);
    }
    std::__cxx11::string::~string((string *)&checkRes.second);
    return PROCESSED;
  }
  return TVar2;
}

Assistant:

TimeProcessingResult TimeCoordinator::processTimeMessage(const ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_TIME_BLOCK:
        case CMD_TIME_UNBLOCK:
        case CMD_TIME_BARRIER:
        case CMD_TIME_BARRIER_CLEAR:
            return processTimeBlockMessage(cmd);
        case CMD_FORCE_TIME_GRANT:
            if (time_granted < cmd.actionTime) {
                time_granted = cmd.actionTime;
                time_grantBase = time_granted;

                ActionMessage treq(CMD_TIME_GRANT);
                treq.source_id = mSourceId;
                treq.actionTime = time_granted;
                lastSend.next = time_granted;
                lastSend.Te = time_granted;
                lastSend.minDe = time_granted;
                lastSend.mTimeState = TimeState::time_granted;
                transmitTimingMessages(treq);
                return TimeProcessingResult::PROCESSED;
            }
            return TimeProcessingResult::NOT_PROCESSED;
        case CMD_DISCONNECT:
        case CMD_BROADCAST_DISCONNECT:
        case CMD_DISCONNECT_CORE:
        case CMD_DISCONNECT_FED:
        case CMD_DISCONNECT_BROKER:
        case CMD_GLOBAL_ERROR:
        case CMD_LOCAL_ERROR:
            // this command requires removing dependents as well as dealing with dependency
            // processing
            removeDependent(cmd.source_id);
            break;
        case CMD_REQUEST_CURRENT_TIME:
            if (disconnected || lastSend.mTimeState == TimeState::error) {
                ActionMessage treq(CMD_DISCONNECT, mSourceId, cmd.source_id);
                treq.setExtraDestData(cmd.counter);
                sendMessageFunction(treq);
            } else {
                auto resp = generateTimeRequest(lastSend, cmd.source_id, cmd.counter);
                if (triggered) {
                    setActionFlag(resp, destination_target);
                    if (cmd.source_id == gRootBrokerID) {
                        triggered = false;
                    }
                }
                sendMessageFunction(resp);
                dependencies.updateTime(cmd);
            }

            return TimeProcessingResult::PROCESSED;
        default:
            break;
    }
    if (isDelayableMessage(cmd, mSourceId)) {
        auto* dep = dependencies.getDependencyInfo(cmd.source_id);
        if (dep == nullptr) {
            return TimeProcessingResult::NOT_PROCESSED;
        }
        switch (dep->mTimeState) {
            case TimeState::time_requested:
                if (dep->next > time_exec) {
                    //     return TimeProcessingResult::delay_processing;
                }
                break;
            case TimeState::time_requested_iterative:
                if (dep->next > time_exec) {
                    //         return TimeProcessingResult::delay_processing;
                }
                if ((iterating != IterationRequest::NO_ITERATIONS) && (time_exec == dep->next)) {
                    //       return TimeProcessingResult::delay_processing;
                }
                break;
            case TimeState::exec_requested_iterative:
                if ((iterating != IterationRequest::NO_ITERATIONS) && (checkingExec) &&
                    (dep->hasData)) {
                    //          return TimeProcessingResult::delay_processing;
                }
                break;
            default:
                break;
        }
    }
    auto procRes = dependencies.updateTime(cmd);
    if (procRes == TimeProcessingResult::PROCESSED_AND_CHECK) {
        auto checkRes = dependencies.checkForIssues(info.wait_for_current_time_updates);
        if (checkRes.first != 0) {
            ActionMessage ge(CMD_GLOBAL_ERROR);
            ge.dest_id = parent_broker_id;
            ge.source_id = mSourceId;
            ge.messageID = checkRes.first;
            ge.payload = checkRes.second;
            sendMessageFunction(ge);
        }
        procRes = TimeProcessingResult::PROCESSED;
    }

    return procRes;
}